

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::DtlsSession::Read(Error *__return_storage_ptr__,DtlsSession *this)

{
  long lVar1;
  ByteArray *aBytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  Error local_828;
  anon_class_1_0_00000001 local_7fa;
  v10 local_7f9;
  v10 *local_7f8;
  size_t local_7f0;
  string local_7e8;
  Error local_7c8;
  allocator<unsigned_char> local_799;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_798;
  allocator<unsigned_char> local_779;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_778;
  string local_760;
  DtlsSession *local_740;
  anon_class_1_0_00000001 local_732;
  v10 local_731;
  v10 *local_730;
  char *local_728;
  string local_720;
  allocator local_6f9;
  string local_6f8;
  anon_class_1_0_00000001 local_6c2;
  v10 local_6c1;
  v10 *local_6c0;
  size_t local_6b8;
  string local_6b0;
  Error local_690;
  uchar local_668 [8];
  uint8_t buf [1024];
  int local_25c;
  DtlsSession *pDStack_258;
  int rval;
  DtlsSession *this_local;
  Error *error;
  undefined1 local_230 [16];
  v10 *local_220;
  ulong local_218;
  v10 *local_210;
  size_t sStack_208;
  string *local_200;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1f8 [3];
  undefined1 local_1e0 [16];
  v10 *local_1d0;
  ulong local_1c8;
  v10 *local_1c0;
  size_t sStack_1b8;
  string *local_1b0;
  v10 *local_1a8;
  v10 **local_1a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  undefined1 local_160 [16];
  v10 *local_150;
  char *local_148;
  string *local_140;
  void **local_138;
  v10 *local_130;
  v10 *local_128;
  char *pcStack_120;
  string *local_118;
  v10 *local_110;
  v10 **local_108;
  v10 *local_100;
  v10 **local_f8;
  v10 **local_f0;
  v10 *local_e8;
  size_t sStack_e0;
  v10 **local_d0;
  v10 *local_c8;
  size_t sStack_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b0;
  undefined1 *local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  Error **local_88;
  undefined1 *local_80;
  Error **local_78;
  undefined8 local_70;
  undefined1 *local_68;
  Error **local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  local_25c = 0;
  pDStack_258 = this;
  this_local = (DtlsSession *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  if (this->mState == kConnected) {
    local_25c = mbedtls_ssl_read(&this->mSsl,local_668,0x400);
    if (local_25c < 1) {
      if (local_25c == -0x6780) {
        this->mState = kConnecting;
      }
      else if (local_25c == 0) {
        Read::anon_class_1_0_00000001::operator()(&local_7fa);
        local_f8 = &local_7f8;
        local_100 = &local_7f9;
        bVar2 = ::fmt::v10::operator()(local_100);
        local_7f0 = bVar2.size_;
        local_7f8 = (v10 *)bVar2.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_200 = &local_7e8;
        local_210 = local_7f8;
        sStack_208 = local_7f0;
        local_d0 = &local_210;
        local_220 = local_7f8;
        local_218 = local_7f0;
        local_c8 = local_220;
        sStack_c0 = local_218;
        error = (Error *)::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
        ;
        local_80 = local_230;
        local_88 = &error;
        local_70 = 0;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)local_88;
        fmt_01.size_ = 0;
        fmt_01.data_ = (char *)local_218;
        local_78 = local_88;
        local_68 = local_80;
        local_60 = local_88;
        ::fmt::v10::vformat_abi_cxx11_(&local_7e8,local_220,fmt_01,args_01);
        Error::Error(&local_7c8,kIOError,&local_7e8);
        Error::operator=(__return_storage_ptr__,&local_7c8);
        Error::~Error(&local_7c8);
        std::__cxx11::string::~string((string *)&local_7e8);
      }
      else {
        ErrorFromMbedtlsError(&local_828,local_25c);
        Error::operator=(__return_storage_ptr__,&local_828);
        Error::~Error(&local_828);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_6f8,"dtls",&local_6f9);
      Read::anon_class_1_0_00000001::operator()(&local_732);
      local_108 = &local_730;
      local_110 = &local_731;
      bVar2 = ::fmt::v10::operator()(local_110);
      local_728 = (char *)bVar2.size_;
      local_730 = (v10 *)bVar2.data_;
      ::fmt::v10::detail::
      check_format_string<void_*,_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                ();
      lVar1 = (long)local_25c;
      local_740 = this;
      std::allocator<unsigned_char>::allocator(&local_779);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_778,local_668,
                 local_668 + lVar1,&local_779);
      utils::Hex_abi_cxx11_(&local_760,(utils *)&local_778,aBytes);
      local_118 = &local_720;
      local_128 = local_730;
      pcStack_120 = local_728;
      local_130 = (v10 *)&local_740;
      local_138 = (void **)&local_25c;
      local_140 = &local_760;
      local_50 = &local_128;
      local_150 = local_730;
      local_148 = local_728;
      local_48 = local_150;
      pcStack_40 = local_148;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*,int,std::__cxx11::string>
                (&local_198,local_130,local_138,(int *)local_140,in_R8);
      local_30 = local_160;
      local_38 = &local_198;
      local_18 = 0xd1e;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_38;
      fmt_00.size_ = 0xd1e;
      fmt_00.data_ = local_148;
      local_28 = local_38;
      local_20 = local_38;
      local_10 = local_30;
      ::fmt::v10::vformat_abi_cxx11_(&local_720,local_150,fmt_00,args_00);
      Log(kDebug,&local_6f8,&local_720);
      std::__cxx11::string::~string((string *)&local_720);
      std::__cxx11::string::~string((string *)&local_760);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_778);
      std::allocator<unsigned_char>::~allocator(&local_779);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
      lVar1 = (long)local_25c;
      std::allocator<unsigned_char>::allocator(&local_799);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_798,local_668,
                 local_668 + lVar1,&local_799);
      std::
      function<void_(ot::commissioner::Endpoint_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
      ::operator()(&(this->super_Endpoint).mReceiver,&this->super_Endpoint,&local_798);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_798);
      std::allocator<unsigned_char>::~allocator(&local_799);
    }
  }
  else {
    Read::anon_class_1_0_00000001::operator()(&local_6c2);
    local_1a0 = &local_6c0;
    local_1a8 = &local_6c1;
    bVar2 = ::fmt::v10::operator()(local_1a8);
    local_6b8 = bVar2.size_;
    local_6c0 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_1b0 = &local_6b0;
    local_1c0 = local_6c0;
    sStack_1b8 = local_6b8;
    local_f0 = &local_1c0;
    local_1d0 = local_6c0;
    local_1c8 = local_6b8;
    local_e8 = local_1d0;
    sStack_e0 = local_1c8;
    local_1f8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_a8 = local_1e0;
    local_b0 = local_1f8;
    local_98 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_b0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_1c8;
    local_a0 = local_b0;
    local_90 = local_a8;
    local_58 = local_b0;
    ::fmt::v10::vformat_abi_cxx11_(&local_6b0,local_1d0,fmt,args);
    Error::Error(&local_690,kInvalidState,&local_6b0);
    Error::operator=(__return_storage_ptr__,&local_690);
    Error::~Error(&local_690);
    std::__cxx11::string::~string((string *)&local_6b0);
  }
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::Read()
{
    int   rval = 0;
    Error error;

    uint8_t buf[kMaxContentLength];

    VerifyOrExit(mState == State::kConnected, error = ERROR_INVALID_STATE("the DTLS session is not connected"));

    rval = mbedtls_ssl_read(&mSsl, buf, sizeof(buf));

    if (rval > 0)
    {
        LOG_DEBUG(LOG_REGION_DTLS, "session(={}) successfully read data: len={}, {}", static_cast<void *>(this), rval,
                  utils::Hex({buf, buf + rval}));
        mReceiver(*this, {buf, buf + static_cast<size_t>(rval)});
        ExitNow();
    }

    switch (rval)
    {
    case 0:
        // \c 0 if the read end of the underlying transport was closed
        // - in this case you must stop using the context (see below)
        error = ERROR_IO_ERROR("underlying transport of the DTLS session was closed");
        break;

    case MBEDTLS_ERR_SSL_CLIENT_RECONNECT:
        // Continue reconnection
        mState = State::kConnecting;
        break;

    default:
        error = ErrorFromMbedtlsError(rval);
        break;
    }

exit:
    return error;
}